

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

void __thiscall
UnifiedRegex::SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::
SyncToLiteralAndContinueInstT
          (SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this,InstTag tag,
          CharCount offset,CharCount length)

{
  CharCount length_local;
  CharCount offset_local;
  InstTag tag_local;
  SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this_local;
  
  Inst::Inst(&this->super_Inst,tag);
  EquivScannerMixinT<4U>::EquivScannerMixinT(&this->super_EquivScannerMixinT<4U>,offset,length);
  return;
}

Assistant:

SyncToLiteralAndContinueInstT(InstTag tag, CharCount offset, CharCount length) : Inst(tag), ScannerT(offset, length) {}